

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * ParseEvent_abi_cxx11_(string *__return_storage_ptr__,istream *is)

{
  istream *piVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar1 = std::ws<char,std::char_traits<char>>(is);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (piVar1,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ParseEvent(istream& is) {
    string event;
    getline(is >> ws, event);
    return event;
}